

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O0

uint32 __thiscall
Js::ByteCodeBufferBuilder::AddConstantTable
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,FunctionBody *function)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  uint32 uVar4;
  Var var_00;
  undefined4 *puVar5;
  Var var;
  RegSlot reg;
  uint32 size;
  FunctionBody *function_local;
  BufferBuilderList *builder_local;
  ByteCodeBufferBuilder *this_local;
  
  var._4_4_ = 0;
  var._0_4_ = 2;
  do {
    RVar3 = FunctionBody::GetConstantCount(function);
    if (RVar3 <= (uint)var) {
      return var._4_4_;
    }
    var_00 = FunctionBody::GetConstantVar(function,(uint)var);
    if (var_00 == (Var)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeSerializer.cpp"
                                  ,0x673,"(var != nullptr)","var != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    uVar4 = PrependVarConstant(this,builder,var_00);
    var._4_4_ = uVar4 + var._4_4_;
    var._0_4_ = (uint)var + 1;
  } while( true );
}

Assistant:

uint32 AddConstantTable(BufferBuilderList & builder, FunctionBody * function)
    {
        uint32 size = 0;

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("Start Constant Table"), magicStartOfConstantTable);
#endif

        for (auto reg = FunctionBody::FirstRegSlot + 1; reg < function->GetConstantCount(); reg++) // Ignore first slot, it is always global object or module root object
        {
            auto var = function->GetConstantVar(reg);
            Assert(var != nullptr);
            size += PrependVarConstant(builder, var);
        }

#ifdef BYTE_CODE_MAGIC_CONSTANTS
        size += PrependInt32(builder, _u("End Constant Table"), magicEndOfConstantTable);
#endif

        return size;
    }